

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game-graphics.cpp
# Opt level: O1

string * __thiscall
Game::Graphics::GameEndScreenOverlay_abi_cxx11_
          (string *__return_storage_ptr__,Graphics *this,end_screen_display_data_t *esdd)

{
  Graphics GVar1;
  Graphics GVar2;
  code *f;
  ostringstream str_os;
  long *local_328;
  long local_320;
  long local_318 [2];
  ostringstream local_308 [112];
  ios_base local_298 [264];
  ostringstream local_190 [112];
  ios_base local_120 [264];
  
  GVar1 = *this;
  GVar2 = this[1];
  std::__cxx11::ostringstream::ostringstream(local_308);
  if (GVar1 == (Graphics)0x0) {
    std::__cxx11::ostringstream::ostringstream(local_190);
    f = GameOverPrompt_abi_cxx11_;
    if (GVar2 != (Graphics)0x0) {
      f = YouWinPrompt_abi_cxx11_;
    }
    DrawAlways<std::__cxx11::string(*)()>((ostream *)local_190,f);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream(local_190);
    std::ios_base::~ios_base(local_120);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_308,(char *)local_328,local_320);
    if (local_328 != local_318) {
      operator_delete(local_328,local_318[0] + 1);
    }
  }
  else {
    DrawAlways<std::__cxx11::string(*)()>((ostream *)local_308,EndOfEndlessPrompt_abi_cxx11_);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_308);
  std::ios_base::~ios_base(local_298);
  return __return_storage_ptr__;
}

Assistant:

std::string GameEndScreenOverlay(end_screen_display_data_t esdd) {
  enum EndScreenDisplayDataFields {
    IDX_FLAG_WIN,
    IDX_FLAG_ENDLESS_MODE,
    MAX_ENDSCREENDISPLAYDATA_INDEXES
  };
  const auto did_win = std::get<IDX_FLAG_WIN>(esdd);
  const auto is_endless_mode = std::get<IDX_FLAG_ENDLESS_MODE>(esdd);

  std::ostringstream str_os;
  const auto standardWinLosePrompt = [=] {
    std::ostringstream str_os;
    DrawOnlyWhen(str_os, did_win, YouWinPrompt);
    // else..
    DrawOnlyWhen(str_os, !did_win, GameOverPrompt);
    return str_os.str();
  };
  DrawOnlyWhen(str_os, !is_endless_mode, standardWinLosePrompt);
  // else..
  DrawOnlyWhen(str_os, is_endless_mode, EndOfEndlessPrompt);
  return str_os.str();
}